

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpermissions.cpp
# Opt level: O3

void QPermissions::Private::requestPermission(QPermission *permission,PermissionCallback *callback)

{
  undefined8 uVar1;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  PermissionStatus local_70 [6];
  char *local_58;
  undefined1 local_50 [16];
  QDebug local_40;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivateLogging::lcPermissions();
  if (((byte)QtPrivateLogging::lcPermissions::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    local_70[0] = Denied;
    local_70[1] = Undetermined;
    local_70[2] = Undetermined;
    local_70[3] = Undetermined;
    local_70[4] = Undetermined;
    local_70[5] = 0;
    local_58 = QtPrivateLogging::lcPermissions::category.name;
    QMessageLogger::debug((QMessageLogger *)local_50);
    uVar1 = local_50._0_8_;
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"No permission backend on this platform.";
    QString::fromUtf8(&local_38,(QString *)0x27,ba);
    ::QTextStream::operator<<((QTextStream *)uVar1,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(bool *)(local_50._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_50._0_8_,' ');
    }
    uVar1 = local_50._0_8_;
    ba_00.m_data = in_RCX;
    ba_00.m_size = (qsizetype)"Optimistically returning Granted for";
    QString::fromUtf8(&local_38,(QString *)0x24,ba_00);
    ::QTextStream::operator<<((QTextStream *)uVar1,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(bool *)(local_50._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_50._0_8_,' ');
    }
    ((Stream *)local_50._0_8_)->ref = ((Stream *)local_50._0_8_)->ref + 1;
    ::operator<<((Stream *)&local_40,(QPermission *)(local_50 + 8));
    QDebug::~QDebug(&local_40);
    QDebug::~QDebug((QDebug *)(local_50 + 8));
    QDebug::~QDebug((QDebug *)local_50);
  }
  local_70[0] = Granted;
  if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      uVar1 = std::__throw_bad_function_call();
      QDebug::~QDebug((QDebug *)(local_50 + 8));
      QDebug::~QDebug((QDebug *)local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        _Unwind_Resume(uVar1);
      }
    }
  }
  else {
    (*callback->_M_invoker)((_Any_data *)callback,local_70);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void requestPermission(const QPermission &permission, const PermissionCallback &callback)
    {
        qCDebug(lcPermissions) << "No permission backend on this platform."
            << "Optimistically returning Granted for" << permission;
        callback(Qt::PermissionStatus::Granted);
    }